

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingQtWriter.cpp
# Opt level: O2

QRect * ZXingQt::WriteBarcode(QStringView text,BarcodeFormat format)

{
  undefined4 in_register_00000014;
  QArrayDataPointer<char16_t> local_a0;
  MultiFormatWriter writer;
  Matrix<unsigned_char> bitmap;
  BitMatrix matrix;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  QStringView text_local;
  
  text_local.m_data = (storage_type_conflict *)CONCAT44(in_register_00000014,format);
  text_local.m_size = (qsizetype)text.m_data;
  writer._encoding = Unknown;
  writer._margin = -1;
  writer._eccLevel = -1;
  QStringView::toString((QString *)&local_a0,&text_local);
  QString::toStdString_abi_cxx11_((string *)&bitmap,(QString *)&local_a0);
  ZXing::MultiFormatWriter::encode((string *)&matrix,(int)&writer,(int)&bitmap);
  std::__cxx11::string::~string((string *)&bitmap);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  ZXing::ToMatrix<unsigned_char>(&bitmap,&matrix,'\0',0xff);
  QImage::QImage((QImage *)&local_a0,
                 bitmap._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,bitmap._width,bitmap._height,
                 (long)bitmap._width,Format_Grayscale8,(_func_void_void_ptr *)0x0,(void *)0x0);
  local_38 = 0;
  uStack_30 = 0xffffffffffffffff;
  QImage::copy((QRect *)text.m_size);
  QImage::~QImage((QImage *)&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bitmap._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  return (QRect *)text.m_size;
}

Assistant:

QImage WriteBarcode(QStringView text, ZXing::BarcodeFormat format)
{
	using namespace ZXing;

#ifdef ZXING_EXPERIMENTAL_API
	auto barcode = CreateBarcodeFromText(text.toString().toStdString(), format);
	auto bitmap = WriteBarcodeToImage(barcode);
#else
	auto writer = MultiFormatWriter(format);
	auto matrix = writer.encode(text.toString().toStdString(), 0, 0);
	auto bitmap = ToMatrix<uint8_t>(matrix);
#endif
	return QImage(bitmap.data(), bitmap.width(), bitmap.height(), bitmap.width(), QImage::Format::Format_Grayscale8).copy();
}